

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_SAR_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  int *in_stack_00000038;
  int *in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  double *in_stack_00000058;
  double *in_stack_00000060;
  int in_stack_0000006c;
  int in_stack_00000070;
  double *in_stack_00000080;
  
  TVar1 = TA_SAR(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058,
                 in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                 in_stack_00000080);
  return TVar1;
}

Assistant:

TA_RetCode TA_SAR_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_SAR(
/* Generated */             startIdx,
/* Generated */             endIdx,
/* Generated */             params->in[0].data.inPrice.high, /* inHigh */
/* Generated */             params->in[0].data.inPrice.low, /* inLow */
/* Generated */             params->optIn[0].data.optInReal, /* optInAcceleration*/
/* Generated */             params->optIn[1].data.optInReal, /* optInMaximum*/
/* Generated */             outBegIdx, 
/* Generated */             outNBElement, 
/* Generated */             params->out[0].data.outReal /*  outReal */ );
/* Generated */ }